

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O1

unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
 __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraSublimeTextGenerator>::
CreateExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraSublimeTextGenerator> *this)

{
  _func_int **pp_Var1;
  pointer *__ptr;
  cmExternalMakefileProjectGeneratorFactory *in_RSI;
  string local_38;
  
  pp_Var1 = (_func_int **)operator_new(0x70);
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)(pp_Var1 + 7);
  pp_Var1[6] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 7) = 0;
  *pp_Var1 = (_func_int *)&PTR__cmExtraSublimeTextGenerator_008d0488;
  pp_Var1[10] = (_func_int *)(pp_Var1 + 0xc);
  pp_Var1[0xb] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 0xc) = 0;
  *(undefined1 *)(pp_Var1 + 9) = 0;
  (this->super_cmExternalMakefileProjectGeneratorFactory).
  _vptr_cmExternalMakefileProjectGeneratorFactory = pp_Var1;
  cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_38,in_RSI);
  std::__cxx11::string::_M_assign((string *)(pp_Var1 + 5));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>,_true,_true>
          )(__uniq_ptr_data<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmExternalMakefileProjectGenerator>
  CreateExternalMakefileProjectGenerator() const override
  {
    std::unique_ptr<cmExternalMakefileProjectGenerator> p(new T);
    p->SetName(this->GetName());
    return p;
  }